

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateParseFromMethods
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  string_view text;
  string local_40;
  char *local_20;
  
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_40,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  local_20 = "@com.google.protobuf.Internal.ProtoMethodMayReturnNull";
  if ((this->context_->options_).opensource_runtime != false) {
    local_20 = anon_var_dwarf_a12c75 + 5;
  }
  text._M_str = 
  "public static $classname$ parseFrom(\n    java.nio.ByteBuffer data)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, data);\n}\npublic static $classname$ parseFrom(\n    java.nio.ByteBuffer data,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, data, extensionRegistry);\n}\npublic static $classname$ parseFrom(\n    com.google.protobuf.ByteString data)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, data);\n}\npublic static $classname$ parseFrom(\n    com.google.protobuf.ByteString data,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, data, extensionRegistry);\n}\npublic static $classname$ parseFrom(byte[] data)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, data);\n}\npublic static $classname$ parseFrom(\n    byte[] data,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, data, extensionRegistry);\n}\npublic static $classname$ parseFrom(java.io.InputStream input)\n    throws java.io.IOException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, input);\n}\npublic static $classname$ parseFrom(\n    java.io.InputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws java.io.IOException {\n  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n      DEFAULT_INSTANCE, input, extens..." /* TRUNCATED STRING LITERAL */
  ;
  text._M_len = 0xbec;
  io::Printer::Print<char[10],std::__cxx11::string,char[31],char_const*>
            (printer,text,(char (*) [10])0x134d25a,&local_40,
             (char (*) [31])"parsedelimitedreturnannotation",&local_20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateParseFromMethods(
    io::Printer* printer) {
  printer->Print(
      "public static $classname$ parseFrom(\n"
      "    java.nio.ByteBuffer data)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
      "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
      "      DEFAULT_INSTANCE, data);\n"
      "}\n"
      "public static $classname$ parseFrom(\n"
      "    java.nio.ByteBuffer data,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
      "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
      "      DEFAULT_INSTANCE, data, extensionRegistry);\n"
      "}\n"
      "public static $classname$ parseFrom(\n"
      "    com.google.protobuf.ByteString data)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
      "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
      "      DEFAULT_INSTANCE, data);\n"
      "}\n"
      "public static $classname$ parseFrom(\n"
      "    com.google.protobuf.ByteString data,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
      "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
      "      DEFAULT_INSTANCE, data, extensionRegistry);\n"
      "}\n"
      "public static $classname$ parseFrom(byte[] data)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
      "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
      "      DEFAULT_INSTANCE, data);\n"
      "}\n"
      "public static $classname$ parseFrom(\n"
      "    byte[] data,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
      "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
      "      DEFAULT_INSTANCE, data, extensionRegistry);\n"
      "}\n"
      "public static $classname$ parseFrom(java.io.InputStream input)\n"
      "    throws java.io.IOException {\n"
      "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
      "      DEFAULT_INSTANCE, input);\n"
      "}\n"
      "public static $classname$ parseFrom(\n"
      "    java.io.InputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws java.io.IOException {\n"
      "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
      "      DEFAULT_INSTANCE, input, extensionRegistry);\n"
      "}\n"
      "$parsedelimitedreturnannotation$\n"
      "public static $classname$ parseDelimitedFrom(java.io.InputStream "
      "input)\n"
      "    throws java.io.IOException {\n"
      "  return parseDelimitedFrom(DEFAULT_INSTANCE, input);\n"
      "}\n"
      "$parsedelimitedreturnannotation$\n"
      "public static $classname$ parseDelimitedFrom(\n"
      "    java.io.InputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws java.io.IOException {\n"
      "  return parseDelimitedFrom(DEFAULT_INSTANCE, input, "
      "extensionRegistry);\n"
      "}\n"
      "public static $classname$ parseFrom(\n"
      "    com.google.protobuf.CodedInputStream input)\n"
      "    throws java.io.IOException {\n"
      "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
      "      DEFAULT_INSTANCE, input);\n"
      "}\n"
      "public static $classname$ parseFrom(\n"
      "    com.google.protobuf.CodedInputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws java.io.IOException {\n"
      "  return com.google.protobuf.GeneratedMessageLite.parseFrom(\n"
      "      DEFAULT_INSTANCE, input, extensionRegistry);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "parsedelimitedreturnannotation",
      context_->options().opensource_runtime
          ? ""
          : "@com.google.protobuf.Internal.ProtoMethodMayReturnNull");
}